

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.hpp
# Opt level: O0

void __thiscall Cache::Block::Block(Block *this)

{
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x116155);
  return;
}

Assistant:

Block() = default;